

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.hpp
# Opt level: O3

void __thiscall deqp::ub::StructType::~StructType(StructType *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  std::vector<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>::~vector
            (&this->m_members);
  pcVar1 = (this->m_typeName)._M_dataplus._M_p;
  paVar2 = &(this->m_typeName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~StructType(void)
	{
	}